

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void av1_resize_and_extend_frame_c
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase_scaler
               ,int num_planes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  InterpKernel *filter_00;
  uint8_t *puVar6;
  int iVar7;
  uint y0_q4;
  int h;
  ulong uVar8;
  long dst_stride;
  ulong uVar9;
  undefined7 in_register_00000011;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint x0_q4;
  int w;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong local_b8;
  uint8_t *local_78;
  
  if (0 < num_planes) {
    uVar11 = 3;
    if (num_planes < 3) {
      uVar11 = (ulong)(uint)num_planes;
    }
    filter_00 = *(InterpKernel **)
                 ((long)&av1_interp_filter_params_list[0].filter_ptr +
                 (ulong)(uint)((int)CONCAT71(in_register_00000011,filter) << 4));
    uVar9 = 0;
    do {
      uVar8 = (ulong)((uint)(uVar9 != 0) * 4);
      iVar1 = *(int *)((long)dst->store_buf_adr + (uVar8 - 0x30));
      uVar12 = (ulong)iVar1;
      if (0 < (long)uVar12) {
        puVar6 = src->store_buf_adr[uVar9 - 4];
        iVar2 = *(int *)((long)src->store_buf_adr + (uVar8 - 0x28));
        iVar3 = *(int *)((long)dst->store_buf_adr + (uVar8 - 0x38));
        local_78 = dst->store_buf_adr[uVar9 - 4];
        lVar16 = (ulong)(uVar9 != 0) * 4;
        dst_stride = (long)*(int *)((long)dst->store_buf_adr + lVar16 + -0x28);
        iVar4 = *(int *)((long)src->store_buf_adr + lVar16 + -0x38);
        iVar5 = *(int *)((long)src->store_buf_adr + lVar16 + -0x30);
        iVar7 = iVar5 * 0x10;
        iVar15 = iVar4 * 0x10;
        local_b8 = 0;
        do {
          y0_q4 = 0;
          if (iVar5 != iVar1) {
            y0_q4 = (iVar7 * (int)local_b8) / iVar1 + phase_scaler & 0xf;
          }
          if (0 < iVar3) {
            iVar13 = (int)(uVar12 - local_b8);
            h = 0x10;
            if (iVar13 < 0x10) {
              h = iVar13;
            }
            iVar13 = 0;
            iVar14 = 0;
            lVar10 = 0;
            lVar16 = (long)iVar3;
            do {
              x0_q4 = 0;
              if (iVar4 != iVar3) {
                x0_q4 = iVar13 / iVar3 + phase_scaler & 0xf;
              }
              if ((lVar16 < 0x10) || ((long)(uVar12 - local_b8) < 0x10)) {
                w = 0x10;
                if ((int)lVar16 < 0x10) {
                  w = (int)lVar16;
                }
                aom_scaled_2d_c(puVar6 + (long)(iVar14 / iVar3) +
                                         (long)(((iVar5 * (int)local_b8) / iVar1) * iVar2),
                                (long)iVar2,local_78 + lVar10,dst_stride,filter_00,x0_q4,
                                iVar15 / iVar3,y0_q4,iVar7 / iVar1,w,h);
              }
              else {
                (*aom_scaled_2d)(puVar6 + (long)(iVar14 / iVar3) +
                                          (long)(((iVar5 * (int)local_b8) / iVar1) * iVar2),
                                 (long)iVar2,local_78 + lVar10,dst_stride,filter_00,x0_q4,
                                 iVar15 / iVar3,y0_q4,iVar7 / iVar1,0x10,0x10);
              }
              lVar10 = lVar10 + 0x10;
              iVar14 = iVar14 + iVar15;
              lVar16 = lVar16 + -0x10;
              iVar13 = iVar13 + iVar4 * 0x100;
            } while ((int)lVar10 < iVar3);
          }
          local_b8 = local_b8 + 0x10;
          local_78 = local_78 + dst_stride * 0x10;
        } while (local_b8 < uVar12);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar11);
  }
  aom_extend_frame_borders_c(dst,num_planes);
  return;
}

Assistant:

void av1_resize_and_extend_frame_c(const YV12_BUFFER_CONFIG *src,
                                   YV12_BUFFER_CONFIG *dst,
                                   const InterpFilter filter,
                                   const int phase_scaler,
                                   const int num_planes) {
  assert(filter == BILINEAR || filter == EIGHTTAP_SMOOTH ||
         filter == EIGHTTAP_REGULAR);
  const InterpKernel *const kernel =
      (const InterpKernel *)av1_interp_filter_params_list[filter].filter_ptr;

  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const uint8_t *src_buffer = src->buffers[i];
    const int src_stride = src->strides[is_uv];
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    uint8_t *dst_buffer = dst->buffers[i];
    const int dst_stride = dst->strides[is_uv];
    for (int y = 0; y < dst_h; y += 16) {
      const int y_q4 =
          src_h == dst_h ? 0 : y * 16 * src_h / dst_h + phase_scaler;
      for (int x = 0; x < dst_w; x += 16) {
        const int x_q4 =
            src_w == dst_w ? 0 : x * 16 * src_w / dst_w + phase_scaler;
        const uint8_t *src_ptr =
            src_buffer + y * src_h / dst_h * src_stride + x * src_w / dst_w;
        uint8_t *dst_ptr = dst_buffer + y * dst_stride + x;

        // Width and height of the actual working area.
        const int work_w = AOMMIN(16, dst_w - x);
        const int work_h = AOMMIN(16, dst_h - y);
        // SIMD versions of aom_scaled_2d() have some trouble handling
        // nonstandard sizes, so fall back on the C version to handle borders.
        if (work_w != 16 || work_h != 16) {
          aom_scaled_2d_c(src_ptr, src_stride, dst_ptr, dst_stride, kernel,
                          x_q4 & 0xf, 16 * src_w / dst_w, y_q4 & 0xf,
                          16 * src_h / dst_h, work_w, work_h);
        } else {
          aom_scaled_2d(src_ptr, src_stride, dst_ptr, dst_stride, kernel,
                        x_q4 & 0xf, 16 * src_w / dst_w, y_q4 & 0xf,
                        16 * src_h / dst_h, 16, 16);
        }
      }
    }
  }
  aom_extend_frame_borders(dst, num_planes);
}